

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle_default.cpp
# Opt level: O1

StyleSheet * __thiscall
QStyleSheetStyle::getDefaultStyleSheet(StyleSheet *__return_storage_ptr__,QStyleSheetStyle *this)

{
  QVariant *pQVar1;
  QList<QCss::Declaration> *pQVar2;
  QList<QCss::Pseudo> *pQVar3;
  QList<QCss::AttributeSelector> *pQVar4;
  QStyle *pQVar5;
  long lVar6;
  QList<QCss::Value> *pQVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QLatin1String QVar47;
  QLatin1String QVar48;
  QLatin1String QVar49;
  QLatin1String QVar50;
  QLatin1String QVar51;
  QLatin1String QVar52;
  QLatin1String QVar53;
  QLatin1String QVar54;
  QLatin1String QVar55;
  QLatin1String QVar56;
  QLatin1String QVar57;
  QLatin1String QVar58;
  QLatin1String QVar59;
  QLatin1String QVar60;
  QLatin1String QVar61;
  QLatin1String QVar62;
  QLatin1String QVar63;
  QLatin1String QVar64;
  QLatin1String QVar65;
  QLatin1String QVar66;
  QLatin1String QVar67;
  QLatin1String QVar68;
  QLatin1String QVar69;
  Declaration decl;
  AttributeSelector attr;
  Pseudo pseudo;
  BasicSelector bSelector;
  StyleRule styleRule;
  Value value;
  QArrayData *local_1f8 [3];
  Declaration local_1e0;
  QArrayDataPointer<QCss::BasicSelector> local_1d8;
  AttributeSelector local_1b8;
  Pseudo local_178;
  BasicSelector local_138;
  StyleRule local_c8;
  QVariant local_88;
  Value local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0xa0);
  memset(__return_storage_ptr__,0,0xa0);
  local_c8.selectors.d.d = (Data *)0x0;
  local_c8.selectors.d.ptr = (Selector *)0x0;
  local_c8.selectors.d.size = 0;
  local_c8.declarations.d.d = (Data *)0x0;
  local_c8.declarations.d.ptr = (Declaration *)0x0;
  local_c8.declarations.d.size = 0;
  local_c8.order = 0;
  local_c8._52_4_ = 0xaaaaaaaa;
  local_138.elementName.d.d = (Data *)0x0;
  local_138.elementName.d.ptr = (char16_t *)0x0;
  local_138.elementName.d.size = 0;
  local_138.ids.d.d = (Data *)0x0;
  local_138.ids.d.ptr = (QString *)0x0;
  local_138.ids.d.size = 0;
  local_138.pseudos.d.d = (Data *)0x0;
  local_138.pseudos.d.ptr = (Pseudo *)0x0;
  local_138.pseudos.d.size = 0;
  local_138.attributeSelectors.d.d = (Data *)0x0;
  local_138.attributeSelectors.d.ptr = (AttributeSelector *)0x0;
  local_138.attributeSelectors.d.size = 0;
  local_138.relationToNext = NoRelation;
  local_138._100_4_ = 0xaaaaaaaa;
  local_1d8.d = (Data *)0x0;
  local_1d8.ptr = (BasicSelector *)0x0;
  local_1d8.size = 0;
  local_1e0.d.d.ptr =
       (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)&DAT_aaaaaaaaaaaaaaaa;
  local_1e0.d.d.ptr =
       (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)operator_new(0x68);
  *(int *)local_1e0.d.d.ptr = 0;
  ((int *)((long)local_1e0.d.d.ptr + 8))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 8))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x10))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x10))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x14))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x14))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x1c))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x1c))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x28))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x28))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x30))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x30))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x38))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x38))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x40))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x40))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x48))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x48))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x50))[0] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x50))[1] = 0;
  ((int *)((long)local_1e0.d.d.ptr + 0x58))[0] = 2;
  ((int *)((long)local_1e0.d.d.ptr + 0x58))[1] = 0;
  *(byte *)((long)local_1e0.d.d.ptr + 0x60) = *(byte *)((long)local_1e0.d.d.ptr + 0x60) & 0xfc;
  LOCK();
  *(int *)local_1e0.d.d.ptr = *(int *)local_1e0.d.d.ptr + 1;
  UNLOCK();
  pQVar1 = &local_68.variant;
  local_68.type = Unknown;
  local_68._4_4_ = 0xaaaaaaaa;
  local_68.variant.d.data.shared = (PrivateShared *)0x0;
  local_68.variant.d.data._8_8_ = 0;
  local_68.variant.d.data._16_8_ = 0;
  local_68.variant.d._24_8_ = 2;
  local_178._57_7_ = 0xaaaaaaaaaaaaaa;
  local_178.type = 0;
  local_178.name.d.d = (Data *)0x0;
  local_178.name.d.ptr = (char16_t *)0x0;
  local_178.name.d.size = 0;
  local_178.function.d.d = (Data *)0x0;
  local_178.function.d.ptr._0_1_ = 0;
  local_178.function.d.ptr._1_7_ = 0;
  local_178.function.d.size._0_1_ = 0;
  local_178.function.d.size._1_7_ = 0;
  local_178.negated = false;
  local_1b8.name.d.d = (Data *)0x0;
  local_1b8.name.d.ptr = (char16_t *)0x0;
  local_1b8.name.d.size = 0;
  local_1b8.value.d.d = (Data *)0x0;
  local_1b8.value.d.ptr = (char16_t *)0x0;
  local_1b8.value.d.size = 0;
  local_1b8.valueMatchCriterium = NoMatch;
  local_1b8._52_4_ = 0xaaaaaaaa;
  pQVar5 = baseStyle(this);
  lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QMacStyle");
  bVar8 = true;
  if (lVar6 == 0) {
    pQVar5 = baseStyle(this);
    lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QWindowsVistaStyle");
    if (lVar6 == 0) {
      bVar8 = false;
    }
    else {
      pQVar5 = baseStyle(this);
      lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QWindows11Style");
      bVar8 = lVar6 == 0;
    }
  }
  QVar16.m_data = "QLineEdit";
  QVar16.m_size = 9;
  QString::operator=(&local_138.elementName,QVar16);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar17.m_data = "-qt-background-role";
  QVar17.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar17);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x44);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  pQVar2 = &local_c8.declarations;
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QVar18.m_data = "border";
  QVar18.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar18);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QVar19.m_data = "-qt-style-features";
  QVar19.m_size = 0x12;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar19);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtStyleFeatures;
  local_68.type = Identifier;
  QVar9.m_data = (storage_type *)0x10;
  QVar9.m_size = (qsizetype)local_1f8;
  QString::fromLatin1(QVar9);
  ::QVariant::QVariant(&local_88,(QString *)local_1f8);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  if (local_1f8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1f8[0],2,0x10);
    }
  }
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar20.m_data = "QLineEdit";
  QVar20.m_size = 9;
  QString::operator=(&local_138.elementName,QVar20);
  local_178.type = 0x20000000;
  QVar21.m_data = "no-frame";
  QVar21.m_size = 8;
  QString::operator=(&local_178.name,QVar21);
  pQVar3 = &local_138.pseudos;
  QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
            ((QMovableArrayOps<QCss::Pseudo> *)pQVar3,local_138.pseudos.d.size,&local_178);
  QList<QCss::Pseudo>::end(pQVar3);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(pQVar3);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar22.m_data = "border";
  QVar22.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar22);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x27);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar23.m_data = "QFrame";
  QVar23.m_size = 6;
  QString::operator=(&local_138.elementName,QVar23);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar24.m_data = "border";
  QVar24.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar24);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(&local_c8.declarations);
  QVar25.m_data = "QLabel";
  QVar25.m_size = 6;
  QString::operator=(&local_138.elementName,QVar25);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  pQVar4 = &local_138.attributeSelectors;
  QList<QCss::AttributeSelector>::clear(pQVar4);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar26.m_data = "QToolBox";
  QVar26.m_size = 8;
  QString::operator=(&local_138.elementName,QVar26);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(pQVar4);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar27.m_data = "background";
  QVar27.m_size = 10;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar27);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Background;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x27);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  pQVar2 = &local_c8.declarations;
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QVar28.m_data = "border-image";
  QVar28.m_size = 0xc;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar28);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = BorderImage;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x27);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar29.m_data = "QGroupBox";
  QVar29.m_size = 9;
  QString::operator=(&local_138.elementName,QVar29);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(pQVar4);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar30.m_data = "border";
  QVar30.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar30);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar31.m_data = "QToolTip";
  QVar31.m_size = 8;
  QString::operator=(&local_138.elementName,QVar31);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(pQVar4);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar32.m_data = "-qt-background-role";
  QVar32.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar32);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x45);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QVar33.m_data = "border";
  QVar33.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar33);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(&local_c8.declarations);
  QVar34.m_data = "QPushButton";
  QVar34.m_size = 0xb;
  QString::operator=(&local_138.elementName,QVar34);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar35.m_data = "QToolButton";
  QVar35.m_size = 0xb;
  QString::operator=(&local_138.elementName,QVar35);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar36.m_data = "border-style";
  QVar36.m_size = 0xc;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar36);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = BorderStyles;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  pQVar1 = &local_68.variant;
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  pQVar2 = &local_c8.declarations;
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  if (!bVar8) {
    QVar37.m_data = "-qt-style-features";
    QVar37.m_size = 0x12;
    QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar37);
    *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_68.type = Identifier;
    QVar10.m_data = (storage_type *)0x10;
    QVar10.m_size = (qsizetype)local_1f8;
    QString::fromLatin1(QVar10);
    ::QVariant::QVariant(&local_88,(QString *)local_1f8);
    ::QVariant::operator=(pQVar1,&local_88);
    ::QVariant::~QVariant(&local_88);
    if (local_1f8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1f8[0],2,0x10);
      }
    }
    pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar7,
               *(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),&local_68);
    QList<QCss::Value>::end(pQVar7);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0
              );
    QList<QCss::Declaration>::end(pQVar2);
    if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
       (*(int *)local_1e0.d.d.ptr != 1)) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  }
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(pQVar2);
  QVar38.m_data = "QComboBox";
  QVar38.m_size = 9;
  QString::operator=(&local_138.elementName,QVar38);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar39.m_data = "border";
  QVar39.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar39);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  pQVar2 = &local_c8.declarations;
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  pQVar1 = &local_68.variant;
  if (!bVar8) {
    QVar40.m_data = "-qt-style-features";
    QVar40.m_size = 0x12;
    QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar40);
    *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_68.type = Identifier;
    QVar11.m_data = (storage_type *)0x10;
    QVar11.m_size = (qsizetype)local_1f8;
    QString::fromLatin1(QVar11);
    ::QVariant::QVariant(&local_88,(QString *)local_1f8);
    ::QVariant::operator=(pQVar1,&local_88);
    ::QVariant::~QVariant(&local_88);
    if (local_1f8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1f8[0],2,0x10);
      }
    }
    pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar7,
               *(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),&local_68);
    QList<QCss::Value>::end(pQVar7);
    local_68.type = Identifier;
    QVar12.m_data = (storage_type *)0x13;
    QVar12.m_size = (qsizetype)local_1f8;
    QString::fromLatin1(QVar12);
    ::QVariant::QVariant(&local_88,(QString *)local_1f8);
    ::QVariant::operator=(pQVar1,&local_88);
    ::QVariant::~QVariant(&local_88);
    if (local_1f8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1f8[0],2,0x10);
      }
    }
    pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar7,
               *(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),&local_68);
    QList<QCss::Value>::end(pQVar7);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0
              );
    QList<QCss::Declaration>::end(pQVar2);
    if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
       (*(int *)local_1e0.d.d.ptr != 1)) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  }
  QVar41.m_data = "-qt-background-role";
  QVar41.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar41);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x44);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(pQVar2);
  pQVar5 = baseStyle(this);
  lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QPlastiqueStyle");
  if (lVar6 == 0) {
    pQVar5 = baseStyle(this);
    lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QCleanlooksStyle");
    if (lVar6 == 0) {
      pQVar5 = baseStyle(this);
      lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QFusionStyle");
      if (lVar6 == 0) goto LAB_00389626;
    }
  }
  QVar42.m_data = "QComboBox";
  QVar42.m_size = 9;
  QString::operator=(&local_138.elementName,QVar42);
  QVar43.m_data = "readOnly";
  QVar43.m_size = 8;
  QString::operator=(&local_1b8.name,QVar43);
  QVar44.m_data = "true";
  QVar44.m_size = 4;
  QString::operator=(&local_1b8.value,QVar44);
  local_1b8.valueMatchCriterium = MatchEqual;
  pQVar4 = &local_138.attributeSelectors;
  QtPrivate::QMovableArrayOps<QCss::AttributeSelector>::emplace<QCss::AttributeSelector_const&>
            ((QMovableArrayOps<QCss::AttributeSelector> *)pQVar4,local_138.attributeSelectors.d.size
             ,&local_1b8);
  QList<QCss::AttributeSelector>::end(pQVar4);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(pQVar4);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar45.m_data = "-qt-background-role";
  QVar45.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar45);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x3c);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(pQVar2);
LAB_00389626:
  QVar46.m_data = "QAbstractSpinBox";
  QVar46.m_size = 0x10;
  QString::operator=(&local_138.elementName,QVar46);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar47.m_data = "border";
  QVar47.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar47);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QVar48.m_data = "-qt-style-features";
  QVar48.m_size = 0x12;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar48);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtStyleFeatures;
  local_68.type = Identifier;
  QVar13.m_data = (storage_type *)0x10;
  QVar13.m_size = (qsizetype)local_1f8;
  QString::fromLatin1(QVar13);
  ::QVariant::QVariant(&local_88,(QString *)local_1f8);
  pQVar1 = &local_68.variant;
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  if (local_1f8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1f8[0],2,0x10);
    }
  }
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QVar49.m_data = "-qt-background-role";
  QVar49.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar49);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x44);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar50.m_data = "QMenu";
  QVar50.m_size = 5;
  QString::operator=(&local_138.elementName,QVar50);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar51.m_data = "-qt-background-role";
  QVar51.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar51);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x45);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(pQVar2);
  if (!bVar8) {
    QVar52.m_data = "QMenu";
    QVar52.m_size = 5;
    QString::operator=(&local_138.elementName,QVar52);
    local_178.type = 0;
    QVar53.m_data = "item";
    QVar53.m_size = 4;
    QString::operator=(&local_178.name,QVar53);
    pQVar3 = &local_138.pseudos;
    QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
              ((QMovableArrayOps<QCss::Pseudo> *)pQVar3,local_138.pseudos.d.size,&local_178);
    QList<QCss::Pseudo>::end(pQVar3);
    QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
              ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
    QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
    QList<QString>::clear(&local_138.ids);
    QList<QCss::Pseudo>::clear(pQVar3);
    QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
    QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
              ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
               (Selector *)&local_1d8);
    QList<QCss::Selector>::end(&local_c8.selectors);
    QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
    QVar54.m_data = "-qt-style-features";
    QVar54.m_size = 0x12;
    QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar54);
    *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_68.type = Identifier;
    QVar14.m_data = (storage_type *)0x10;
    QVar14.m_size = (qsizetype)local_1f8;
    QString::fromLatin1(QVar14);
    ::QVariant::QVariant(&local_88,(QString *)local_1f8);
    ::QVariant::operator=(pQVar1,&local_88);
    ::QVariant::~QVariant(&local_88);
    if (local_1f8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1f8[0],2,0x10);
      }
    }
    pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar7,
               *(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),&local_68);
    QList<QCss::Value>::end(pQVar7);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0
              );
    QList<QCss::Declaration>::end(pQVar2);
    if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
       (*(int *)local_1e0.d.d.ptr != 1)) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
    QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
              ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
               (__return_storage_ptr__->styleRules).d.size,&local_c8);
    QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
    QList<QCss::Selector>::clear(&local_c8.selectors);
    QList<QCss::Declaration>::clear(pQVar2);
  }
  QVar55.m_data = "QHeaderView";
  QVar55.m_size = 0xb;
  QString::operator=(&local_138.elementName,QVar55);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar56.m_data = "-qt-background-role";
  QVar56.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar56);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x45);
  ::QVariant::operator=(pQVar1,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(&local_c8.declarations);
  QVar57.m_data = "QTableCornerButton";
  QVar57.m_size = 0x12;
  QString::operator=(&local_138.elementName,QVar57);
  local_178.type = 0;
  QVar58.m_data = "section";
  QVar58.m_size = 7;
  QString::operator=(&local_178.name,QVar58);
  pQVar3 = &local_138.pseudos;
  QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
            ((QMovableArrayOps<QCss::Pseudo> *)pQVar3,local_138.pseudos.d.size,&local_178);
  QList<QCss::Pseudo>::end(pQVar3);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(pQVar3);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar59.m_data = "QHeaderView";
  QVar59.m_size = 0xb;
  QString::operator=(&local_138.elementName,QVar59);
  local_178.type = 0;
  QVar60.m_data = "section";
  QVar60.m_size = 7;
  QString::operator=(&local_178.name,QVar60);
  QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
            ((QMovableArrayOps<QCss::Pseudo> *)pQVar3,local_138.pseudos.d.size,&local_178);
  QList<QCss::Pseudo>::end(pQVar3);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(pQVar3);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar61.m_data = "-qt-background-role";
  QVar61.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar61);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x3c);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  pQVar2 = &local_c8.declarations;
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  if (!bVar8) {
    QVar62.m_data = "-qt-style-features";
    QVar62.m_size = 0x12;
    QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar62);
    *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_68.type = Identifier;
    QVar15.m_data = (storage_type *)0x10;
    QVar15.m_size = (qsizetype)local_1f8;
    QString::fromLatin1(QVar15);
    ::QVariant::QVariant(&local_88,(QString *)local_1f8);
    ::QVariant::operator=(&local_68.variant,&local_88);
    ::QVariant::~QVariant(&local_88);
    if (local_1f8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1f8[0],2,0x10);
      }
    }
    pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar7,
               *(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),&local_68);
    QList<QCss::Value>::end(pQVar7);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0
              );
    QList<QCss::Declaration>::end(pQVar2);
    if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
       (*(int *)local_1e0.d.d.ptr != 1)) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  }
  QVar63.m_data = "border";
  QVar63.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar63);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar64.m_data = "QProgressBar";
  QVar64.m_size = 0xc;
  QString::operator=(&local_138.elementName,QVar64);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar65.m_data = "-qt-background-role";
  QVar65.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar65);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x44);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar66.m_data = "QScrollBar";
  QVar66.m_size = 10;
  QString::operator=(&local_138.elementName,QVar66);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar67.m_data = "-qt-background-role";
  QVar67.m_size = 0x13;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar67);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x45);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  pQVar2 = &local_c8.declarations;
  QList<QCss::Declaration>::clear(pQVar2);
  QVar68.m_data = "QDockWidget";
  QVar68.m_size = 0xb;
  QString::operator=(&local_138.elementName,QVar68);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1d8,local_1d8.size,&local_138);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1d8);
  QList<QString>::clear(&local_138.ids);
  QList<QCss::Pseudo>::clear(&local_138.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_138.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_c8,local_c8.selectors.d.size,
             (Selector *)&local_1d8);
  QList<QCss::Selector>::end(&local_c8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1d8);
  QVar69.m_data = "border";
  QVar69.m_size = 6;
  QString::operator=((QString *)((long)local_1e0.d.d.ptr + 8),QVar69);
  *(Property *)((long)local_1e0.d.d.ptr + 0x20) = Border;
  local_68.type = KnownIdentifier;
  ::QVariant::QVariant(&local_88,0x18);
  ::QVariant::operator=(&local_68.variant,&local_88);
  ::QVariant::~QVariant(&local_88);
  pQVar7 = (QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar7,*(qsizetype *)((long)local_1e0.d.d.ptr + 0x38),
             &local_68);
  QList<QCss::Value>::end(pQVar7);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar2,local_c8.declarations.d.size,&local_1e0);
  QList<QCss::Declaration>::end(pQVar2);
  if ((local_1e0.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) &&
     (*(int *)local_1e0.d.d.ptr != 1)) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1e0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1e0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_c8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_c8.selectors);
  QList<QCss::Declaration>::clear(pQVar2);
  __return_storage_ptr__->origin = StyleSheetOrigin_UserAgent;
  QCss::StyleSheet::buildIndexes((CaseSensitivity)__return_storage_ptr__);
  if (&(local_1b8.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1b8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_1b8.value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1b8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1b8.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_178.function.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_178.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_178.function.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_178.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  ::QVariant::~QVariant(&local_68.variant);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
            (&local_1e0.d);
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_1d8);
  QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(&local_138.attributeSelectors.d);
  QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&local_138.pseudos.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138.ids.d);
  if (&(local_138.elementName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_138.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_138.elementName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&pQVar2->d);
  QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::Selector> *)&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

StyleSheet QStyleSheetStyle::getDefaultStyleSheet() const
{
    StyleSheet sheet;
    StyleRule styleRule;
    BasicSelector bSelector;
    Selector selector;
    Declaration decl;
    QCss::Value value;
    Pseudo pseudo;
    AttributeSelector attr;

    // pixmap based style doesn't support any features
    bool styleIsPixmapBased = baseStyle()->inherits("QMacStyle")
            || (baseStyle()->inherits("QWindowsVistaStyle")
                && !baseStyle()->inherits("QWindows11Style"));


    /*QLineEdit {
        -qt-background-role: base;
        border: native;
        -qt-style-features: background-color;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLineEdit:no-frame {
        border: none;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_PSEUDO("no-frame"_L1, PseudoClass_Frameless);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QFrame {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QFrame"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLabel, QToolBox {
        background: none;
        border-image: none;
    }*/
    {
        SET_ELEMENT_NAME("QLabel"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("background"_L1, Background);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        SET_PROPERTY("border-image"_L1, BorderImage);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QGroupBox {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QGroupBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }


    /*QToolTip {
        -qt-background-role: window;
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QToolTip"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QPushButton, QToolButton {
        border-style: native;
        -qt-style-features: background-color;  //only for not pixmap based styles
    }*/
    {
        SET_ELEMENT_NAME("QPushButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border-style"_L1, BorderStyles);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }


        ADD_STYLE_RULE;
    }


    /*QComboBox {
        border: native;
        -qt-style-features: background-color background-gradient;   //only for not pixmap based styles
        -qt-background-role: base;
    }*/

    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-gradient"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QComboBox[style="QPlastiqueStyle"][readOnly="true"],
    QComboBox[style="QFusionStyle"][readOnly="true"],
    QComboBox[style="QCleanlooksStyle"][readOnly="true"]
    {
        -qt-background-role: button;
    }*/
    if (baseStyle()->inherits("QPlastiqueStyle")  || baseStyle()->inherits("QCleanlooksStyle") || baseStyle()->inherits("QFusionStyle"))
    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_ATTRIBUTE_SELECTOR("readOnly"_L1, "true"_L1, AttributeSelector::MatchEqual);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QAbstractSpinBox {
        border: native;
        -qt-style-features: background-color;
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QAbstractSpinBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QMenu {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }
    /*QMenu::item {
        -qt-style-features: background-color;
    }*/
    if (!styleIsPixmapBased) {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_PSEUDO("item"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QHeaderView {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QTableCornerButton::section, QHeaderView::section {
        -qt-background-role: button;
        -qt-style-features: background-color; //if style is not pixmap based
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QTableCornerButton"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QProgressBar {
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QProgressBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QScrollBar {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QScrollBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QDockWidget {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QDockWidget"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    sheet.origin = StyleSheetOrigin_UserAgent;
    sheet.buildIndexes();
    return sheet;
}